

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O3

UBool __thiscall icu_63::OlsonTimeZone::hasSameRules(OlsonTimeZone *this,TimeZone *other)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  UBool UVar5;
  int iVar6;
  long lVar7;
  
  if (this == (OlsonTimeZone *)other) {
    return '\x01';
  }
  lVar7 = __dynamic_cast(other,&TimeZone::typeinfo,&typeinfo,0);
  if (lVar7 == 0) {
    return '\0';
  }
  if (this->typeMapData == *(uint8_t **)(lVar7 + 0x78)) {
    return '\x01';
  }
  if (this->finalZone == (SimpleTimeZone *)0x0) {
    if (*(long *)(lVar7 + 0x80) != 0) {
      return '\0';
    }
  }
  else {
    if (*(long *)(lVar7 + 0x80) == 0) {
      return '\0';
    }
    iVar6 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[3])
                      ();
    if ((char)iVar6 == '\0') {
      return '\0';
    }
    if (this->finalZone != (SimpleTimeZone *)0x0) {
      if (this->finalStartYear != *(int *)(lVar7 + 0x90)) {
        return '\0';
      }
      if (this->finalStartMillis != *(double *)(lVar7 + 0x88)) {
        return '\0';
      }
      if (NAN(this->finalStartMillis) || NAN(*(double *)(lVar7 + 0x88))) {
        return '\0';
      }
    }
  }
  sVar1 = this->typeCount;
  if (sVar1 == *(short *)(lVar7 + 0x68)) {
    sVar2 = this->transitionCountPre32;
    if (sVar2 == *(short *)(lVar7 + 0x48)) {
      sVar3 = this->transitionCount32;
      if (sVar3 == *(short *)(lVar7 + 0x4a)) {
        sVar4 = this->transitionCountPost32;
        if ((((sVar4 == *(short *)(lVar7 + 0x4c)) &&
             (UVar5 = arrayEqual(this->transitionTimesPre32,*(void **)(lVar7 + 0x50),sVar2 * 8),
             UVar5 != '\0')) &&
            (UVar5 = arrayEqual(this->transitionTimes32,*(void **)(lVar7 + 0x58),sVar3 * 4),
            UVar5 != '\0')) &&
           ((UVar5 = arrayEqual(this->transitionTimesPost32,*(void **)(lVar7 + 0x60),sVar4 * 8),
            UVar5 != '\0' &&
            (UVar5 = arrayEqual(this->typeOffsets,*(void **)(lVar7 + 0x70),(int)sVar1 << 3),
            UVar5 != '\0')))) {
          UVar5 = arrayEqual(this->typeMapData,*(void **)(lVar7 + 0x78),
                             (int)(short)(sVar3 + sVar2 + sVar4));
          return UVar5;
        }
      }
    }
  }
  return '\0';
}

Assistant:

UBool
OlsonTimeZone::hasSameRules(const TimeZone &other) const {
    if (this == &other) {
        return TRUE;
    }
    const OlsonTimeZone* z = dynamic_cast<const OlsonTimeZone*>(&other);
    if (z == NULL) {
        return FALSE;
    }

    // [sic] pointer comparison: typeMapData points into
    // memory-mapped or DLL space, so if two zones have the same
    // pointer, they are equal.
    if (typeMapData == z->typeMapData) {
        return TRUE;
    }
    
    // If the pointers are not equal, the zones may still
    // be equal if their rules and transitions are equal
    if ((finalZone == NULL && z->finalZone != NULL)
        || (finalZone != NULL && z->finalZone == NULL)
        || (finalZone != NULL && z->finalZone != NULL && *finalZone != *z->finalZone)) {
        return FALSE;
    }

    if (finalZone != NULL) {
        if (finalStartYear != z->finalStartYear || finalStartMillis != z->finalStartMillis) {
            return FALSE;
        }
    }
    if (typeCount != z->typeCount
        || transitionCountPre32 != z->transitionCountPre32
        || transitionCount32 != z->transitionCount32
        || transitionCountPost32 != z->transitionCountPost32) {
        return FALSE;
    }

    return
        arrayEqual(transitionTimesPre32, z->transitionTimesPre32, sizeof(transitionTimesPre32[0]) * transitionCountPre32 << 1)
        && arrayEqual(transitionTimes32, z->transitionTimes32, sizeof(transitionTimes32[0]) * transitionCount32)
        && arrayEqual(transitionTimesPost32, z->transitionTimesPost32, sizeof(transitionTimesPost32[0]) * transitionCountPost32 << 1)
        && arrayEqual(typeOffsets, z->typeOffsets, sizeof(typeOffsets[0]) * typeCount << 1)
        && arrayEqual(typeMapData, z->typeMapData, sizeof(typeMapData[0]) * transitionCount());
}